

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O2

LispPTR N_OP_misc3(LispPTR baseL,LispPTR typenumber,LispPTR inx,int alpha)

{
  LispPTR *pLVar1;
  LispPTR type;
  LispPTR LVar2;
  
  if (alpha != 9) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx & 0xfff0000) == 0xe0000) {
    LVar2 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar1 = NativeAligned4FromLAddr(inx);
    LVar2 = *pLVar1;
    if ((int)LVar2 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) != 0xe0000) {
    if ((*(ushort *)((ulong)(typenumber >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
      pLVar1 = NativeAligned4FromLAddr(typenumber);
      type = *pLVar1;
      if (-1 < (int)type) goto LAB_00107a12;
    }
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  type = typenumber & 0xffff;
LAB_00107a12:
  LVar2 = aref_switch(type,inx,baseL,LVar2);
  return LVar2;
}

Assistant:

LispPTR N_OP_misc3(LispPTR baseL, LispPTR typenumber, LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 9) ERROR_EXIT(inx);
  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  /*  dispatch on type  */
  return (aref_switch((unsigned)type, inx, baseL, index));
}